

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O1

VectorNd __thiscall HermiteSpline<3U,_1U>::interpolate(HermiteSpline<3U,_1U> *this,double s)

{
  double dVar1;
  long lVar2;
  VectorNd *p;
  long lVar3;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  double s_;
  plain_array<double,_1,_0,_0> pVar4;
  double dVar5;
  double dVar6;
  
  lVar2 = *(long *)CONCAT71(in_register_00000031,in_SIL);
  lVar3 = *(long *)(CONCAT71(in_register_00000031,in_SIL) + 8);
  dVar1 = *(double *)(lVar2 + 0x20);
  if (dVar1 < s && lVar3 != lVar2) {
    do {
      s = s - dVar1;
      if (s <= dVar1) break;
    } while (lVar3 != lVar2);
  }
  dVar5 = 1.0;
  if (s <= 1.0) {
    dVar5 = s;
  }
  pVar4.array[0] = (double  [1])0x0;
  lVar3 = 0;
  dVar6 = 1.0;
  do {
    pVar4.array[0] = (double  [1])((double)pVar4.array[0] + dVar6 * *(double *)(lVar2 + lVar3 * 8));
    lVar3 = lVar3 + 1;
    dVar6 = (dVar5 / dVar1) * dVar6;
  } while (lVar3 != 4);
  (this->children).
  super__Vector_base<UnitBoundedPolynomial<3U,_1U>,_std::allocator<UnitBoundedPolynomial<3U,_1U>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pVar4.array[0];
  return (VectorNd)pVar4.array[0];
}

Assistant:

typename HermiteSpline<Order, Dims>::VectorNd HermiteSpline<Order, Dims>::interpolate(double s)
{
    int m = 0;
    double s_ = s;

    while (s_ > children[m].length && m < children.size())
    {
        s_ -= children[m].length;
    }

    if (s_ >= 1.0)
    {
        s_ = 1.0;
    }

    return children[m].interpolate(s_ / children[m].length);
}